

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinter.cpp
# Opt level: O0

void return_10_proc(Am_Object *self)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  void *pvVar3;
  Am_Value local_48;
  Am_Object local_38 [3];
  Am_Object local_20;
  Am_Object local_18;
  Am_Object window;
  Am_Object *self_local;
  
  window.data = (Am_Object_Data *)self;
  Am_Object::Am_Object(&local_18);
  Am_Object::Get_Object((ushort)&local_20,(ulong)self);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&local_20,0x68);
  Am_Object::operator=(&local_18,pAVar1);
  Am_Object::~Am_Object(&local_20);
  poVar2 = std::operator<<((ostream *)&std::cout,"Calling Finish_Pop_Up_Waiting on ");
  pvVar3 = (void *)operator<<(poVar2,(Am_Object *)&local_18);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
  Am_Object::Am_Object(local_38,(Am_Object *)&local_18);
  Am_Value::Am_Value(&local_48,10);
  Am_Finish_Pop_Up_Waiting((Am_Object *)local_38,(Am_Value *)&local_48);
  Am_Value::~Am_Value(&local_48);
  Am_Object::~Am_Object(local_38);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, return_10, (Am_Object self))
{
  Am_Object window;
  window = self.Get_Object(Am_SAVED_OLD_OWNER).Get(Am_WINDOW);
  cout << "Calling Finish_Pop_Up_Waiting on " << window << endl << flush;
  Am_Finish_Pop_Up_Waiting(window, 10);
}